

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::copyAppend
          (QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,
          pair<QModelIndex,_QPersistentModelIndex> *b,pair<QModelIndex,_QPersistentModelIndex> *e)

{
  pair<QModelIndex,_QPersistentModelIndex> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<QModelIndex,_QPersistentModelIndex> *in_RDI;
  pair<QModelIndex,_QPersistentModelIndex> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::begin
                        ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                         0x8aafd7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<QModelIndex,_QPersistentModelIndex>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->first).m.ptr =
           (QAbstractItemModel *)((long)&(((in_RDI->first).m.ptr)->super_QObject)._vptr_QObject + 1)
      ;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }